

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

void __thiscall
booster::aio::stream_socket::async_write(stream_socket *this,const_buffer *buffer,io_handler *h)

{
  long __return_storage_ptr__;
  callable<void_(const_std::error_code_&,_unsigned_long)> *pcVar1;
  void *pvVar2;
  basic_io_device *this_00;
  _func_int ***this_01;
  bool bVar3;
  error_category *peVar4;
  size_t sVar5;
  size_t sVar6;
  pointer_type pVar7;
  io_service *piVar8;
  pointer r;
  error_code e;
  error_code e_1;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> local_a0;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> local_98;
  const_buffer local_90;
  undefined **local_60;
  error_category *local_58;
  error_code local_50;
  error_code local_40;
  
  bVar3 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (!bVar3) {
    return;
  }
  local_50._M_value = 0;
  peVar4 = (error_category *)std::_V2::system_category();
  local_50._M_cat = peVar4;
  sVar5 = write_some(this,buffer,&local_50);
  if (((local_50._M_value != 0) ||
      (sVar6 = buffer_impl<const_char_*>::bytes_count(&buffer->super_buffer_impl<const_char_*>),
      sVar5 == sVar6)) &&
     ((local_50._M_value == 0 || (bVar3 = basic_io_device::would_block(&local_50), !bVar3)))) {
    piVar8 = basic_io_device::get_io_service((basic_io_device *)this);
    io_service::post(piVar8,h,&local_50,sVar5);
    return;
  }
  local_58 = peVar4;
  pVar7.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x58);
  local_60 = &PTR__refcounted_001cfeb0;
  ((pVar7.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cfeb0;
  this_01 = (_func_int ***)&((pVar7.p_)->super_refcounted).refs_;
  atomic_counter::atomic_counter((atomic_counter *)this_01,0);
  ((pVar7.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__writer_all_001d03c0;
  __return_storage_ptr__ = (long)(pVar7.p_ + 1);
  details::advance<booster::aio::const_buffer>((const_buffer *)__return_storage_ptr__,buffer,sVar5);
  *(size_t *)(pVar7.p_ + 4) = sVar5;
  *(stream_socket **)((long)(pVar7.p_ + 4) + 8) = this;
  pcVar1 = (h->call_ptr).p_;
  *(callable<void_(const_std::error_code_&,_unsigned_long)> **)(pVar7.p_ + 5) = pcVar1;
  if (pcVar1 != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
    atomic_counter::inc((atomic_counter *)(pcVar1 + 8));
  }
  local_a0.p_ = (writer_all *)pVar7.p_;
  atomic_counter::inc((atomic_counter *)this_01);
  local_40._M_value = 0;
  local_40._M_cat = local_58;
  sVar5 = write_some(*(stream_socket **)((long)(pVar7.p_ + 4) + 8),
                     (const_buffer *)__return_storage_ptr__,&local_40);
  *(size_t *)(pVar7.p_ + 4) = *(long *)(pVar7.p_ + 4) + sVar5;
  details::advance<booster::aio::const_buffer>
            (&local_90,(const_buffer *)__return_storage_ptr__,sVar5);
  *(size_t *)(pVar7.p_ + 2) = local_90.super_buffer_impl<const_char_*>.entry_.size;
  *(undefined8 *)__return_storage_ptr__ = local_90.super_buffer_impl<const_char_*>._0_8_;
  *(char **)((long)(pVar7.p_ + 1) + 8) = local_90.super_buffer_impl<const_char_*>.entry_.ptr;
  pvVar2 = *(void **)((long)(pVar7.p_ + 2) + 8);
  *(pointer *)((long)(pVar7.p_ + 2) + 8) =
       local_90.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(pVar7.p_ + 3) =
       local_90.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)(pVar7.p_ + 3) + 8) =
       local_90.super_buffer_impl<const_char_*>.vec_.
       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_90.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2);
  }
  if (local_90.super_buffer_impl<const_char_*>.vec_.
      super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super_buffer_impl<const_char_*>.vec_.
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((*(int *)__return_storage_ptr__ == 0) ||
     ((local_40._M_value != 0 && (bVar3 = basic_io_device::would_block(&local_40), !bVar3)))) {
    piVar8 = basic_io_device::get_io_service(*(basic_io_device **)((long)(pVar7.p_ + 4) + 8));
    io_service::post(piVar8,(io_handler *)(pVar7.p_ + 5),&local_40,*(size_t *)(pVar7.p_ + 4));
  }
  else {
    this_00 = *(basic_io_device **)((long)(pVar7.p_ + 4) + 8);
    local_98.p_ = (writer_all *)pVar7.p_;
    atomic_counter::inc((atomic_counter *)this_01);
    local_90.super_buffer_impl<const_char_*>._0_8_ = pVar7.p_;
    atomic_counter::inc((atomic_counter *)this_01);
    basic_io_device::on_writeable(this_00,(event_handler *)&local_90);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_90);
    intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr(&local_98);
  }
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr(&local_a0);
  return;
}

Assistant:

void stream_socket::async_write(const_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;

	#ifdef BOOSTER_AIO_FORCE_POLL
	writer_all::pointer r(new writer_all(this,buffer,0,h));
	r->run();
	#else
	system::error_code e;
	size_t n = write_some(buffer,e);
	if((!e && n!=buffer.bytes_count()) || (e && would_block(e))) {
		writer_all::pointer r(new writer_all(this,buffer,n,h));
		r->run();
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif




}